

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall curlpp::LibcurlLogicError::~LibcurlLogicError(LibcurlLogicError *this)

{
  std::logic_error::~logic_error((logic_error *)this);
  operator_delete(this);
  return;
}

Assistant:

class CURLPPAPI LibcurlLogicError : public curlpp::LogicError
	{

	public:

		LibcurlLogicError(const std::string & reason, CURLcode code);
		LibcurlLogicError(const char * reason, CURLcode code);

		/* 
		* return the CURLcode that libcurl returned
		*/
		CURLcode whatCode() const throw();

	private:

		CURLcode mCode;

	}